

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O1

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::ReplicatedAssignmentPatternExpression>
          (ConstraintExprVisitor *this,ReplicatedAssignmentPatternExpression *expr)

{
  bool bVar1;
  ExpressionKind EVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  pointer ppEVar6;
  Expression *pEVar7;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar8;
  long lVar9;
  bool bVar10;
  char cVar11;
  RandMode RVar12;
  SubroutineKind SVar13;
  Symbol *symbol;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar14;
  SourceLocation SVar15;
  long lVar17;
  DiagCode code;
  ASTContext *this_00;
  BinaryExpression *binExpr;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  byte local_33;
  SourceLocation SVar16;
  
  if ((this->failed != false) || (bVar10 = Expression::bad((Expression *)expr), bVar10))
  goto LAB_00399e85;
  symbol = Expression::getSymbolReference((Expression *)expr,true);
  if (symbol != (Symbol *)0x0) {
    RVar12 = ASTContext::getRandMode(this->context,symbol);
    if (RVar12 != None) {
      this->sawRandVars = true;
    }
    if ((RVar12 == RandC) && (this->isSoft != false)) {
      ASTContext::addDiag(this->context,(DiagCode)0x390008,
                          (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange
                         );
    }
  }
  EVar2 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  if ((EVar2 < Conversion) && ((0x340000U >> (EVar2 & ValueRange) & 1) != 0)) {
    cVar11 = '\0';
  }
  else {
    bVar10 = this->isTop;
    bVar1 = this->sawRandVars;
    this->isTop = false;
    this->sawRandVars = false;
    Expression::visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
              (expr->count_,expr->count_,this);
    sVar5 = (expr->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value;
    if (sVar5 != 0) {
      ppEVar6 = (expr->super_AssignmentPatternExpressionBase).elements_._M_ptr;
      lVar17 = 0;
      do {
        pEVar7 = *(Expression **)((long)ppEVar6 + lVar17);
        Expression::visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
                  (pEVar7,pEVar7,this);
        lVar17 = lVar17 + 8;
      } while (sVar5 << 3 != lVar17);
    }
    this->isTop = bVar10;
    cVar11 = this->sawRandVars;
    this->sawRandVars = bVar1;
  }
  EVar2 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  switch(EVar2) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&local_40,
                 (SVIntStorage *)&(expr->super_AssignmentPatternExpressionBase).elements_._M_extent)
    ;
    goto LAB_00399d44;
  case RealLiteral:
  case TimeLiteral:
    this_00 = this->context;
    if (0 < (int)(((this_00->scope).ptr)->compilation->options).languageVersion) break;
    SVar16 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
    SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2f;
    goto LAB_00399c7d;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&local_40);
LAB_00399d44:
    if ((0x40 < local_38 || (local_33 & 1) != 0) && ((void *)local_40.val != (void *)0x0)) {
      operator_delete__(local_40.pVal);
    }
    if ((local_33 & 1) == 0) {
      return true;
    }
    this_00 = this->context;
    SVar16 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
    SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x50;
    goto LAB_00399c7d;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case UnaryOp:
  case ConditionalOp:
  case Inside:
  case Assignment:
  case Concatenation:
  case Replication:
  case ElementSelect:
  case RangeSelect:
  case MemberAccess:
    break;
  case NamedValue:
  case HierarchicalValue:
    if (this->isTop == false) {
      return true;
    }
    break;
  case BinaryOp:
    uVar3 = *(uint *)&expr->count_;
    if (uVar3 < 0x17) {
      if ((0x79e600U >> (uVar3 & 0x1f) & 1) == 0) {
        if ((0x61800U >> (uVar3 & 0x1f) & 1) != 0) goto switchD_00399c2d_caseD_11;
      }
      else if ((cVar11 != '\0') &&
              (((pEVar7 = (Expression *)
                          (expr->super_AssignmentPatternExpressionBase).elements_._M_ptr,
                (pEVar7->kind & ~IntegerLiteral) == NamedValue &&
                (bVar10 = checkType(this,pEVar7), !bVar10)) ||
               ((pEVar7 = (Expression *)
                          (expr->super_AssignmentPatternExpressionBase).elements_._M_extent.
                          _M_extent_value, (pEVar7->kind & ~IntegerLiteral) == NamedValue &&
                (bVar10 = checkType(this,pEVar7), !bVar10)))))) goto LAB_00399e85;
    }
    break;
  case Streaming:
switchD_00399c2d_caseD_11:
    this_00 = this->context;
    SVar16 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
    SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x18;
LAB_00399c7d:
    sourceRange.endLoc = SVar15;
    sourceRange.startLoc = SVar16;
    ASTContext::addDiag(this_00,code,sourceRange);
    goto LAB_00399e85;
  case Call:
    SVar13 = CallExpression::getSubroutineKind((CallExpression *)expr);
    if (SVar13 == Task) {
      this_00 = this->context;
      SVar16 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
      SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
      code.subsystem = Statements;
      code.code = 0x4b;
      goto LAB_00399c7d;
    }
    if (*(char *)&expr[1].super_AssignmentPatternExpressionBase.super_Expression.syntax != '\x01') {
      ppSVar14 = std::
                 get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)&(expr->super_AssignmentPatternExpressionBase).elements_);
      pSVar8 = *ppSVar14;
      if ((pSVar8->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pSVar8->super_Scope);
      }
      sVar5 = (pSVar8->arguments)._M_extent._M_extent_value;
      bVar10 = sVar5 == 0;
      if (!bVar10) {
        lVar17 = 0;
        bVar10 = false;
        do {
          lVar9 = *(long *)((long)(pSVar8->arguments)._M_ptr + lVar17);
          iVar4 = *(int *)(lVar9 + 0x158);
          if (iVar4 == 3) {
            if ((*(byte *)(lVar9 + 0x154) & 1) == 0) goto LAB_00399e57;
          }
          else if (iVar4 - 1U < 2) {
LAB_00399e57:
            ASTContext::addDiag(this->context,(DiagCode)0x320008,
                                (expr->super_AssignmentPatternExpressionBase).super_Expression.
                                sourceRange);
            this->failed = true;
            break;
          }
          lVar17 = lVar17 + 8;
          bVar10 = sVar5 << 3 == lVar17;
        } while (!bVar10);
      }
      if (!bVar10) {
        return false;
      }
    }
    break;
  default:
    switch(EVar2) {
    case ValueRange:
      return true;
    case Dist:
      local_40 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this->context;
      local_38 = local_38 & 0xffffff00;
      pEVar7 = (Expression *)(expr->super_AssignmentPatternExpressionBase).elements_._M_ptr;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                (pEVar7,pEVar7,(DistVarVisitor *)&local_40);
      if ((char)local_38 == '\0') {
        ASTContext::addDiag(this->context,(DiagCode)0x3c0008,pEVar7->sourceRange);
        return true;
      }
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_00399c2d_caseD_11;
    }
  }
  bVar10 = checkType(this,(Expression *)expr);
  if (bVar10) {
    return true;
  }
LAB_00399e85:
  this->failed = true;
  return false;
}

Assistant:

bool visit(const T& expr) {
        if (failed || expr.bad())
            return fail();

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (auto sym = expr.getSymbolReference()) {
                RandMode mode = context.getRandMode(*sym);
                if (mode != RandMode::None)
                    sawRandVars = true;

                if (isSoft && mode == RandMode::RandC)
                    context.addDiag(diag::RandCInSoft, expr.sourceRange);
            }

            bool childrenHaveRand = false;

            if constexpr (HasVisitExprs<T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {

                    const bool oldTop = std::exchange(isTop, false);
                    const bool oldSawRand = std::exchange(sawRandVars, false);
                    expr.visitExprs(*this);
                    isTop = oldTop;
                    childrenHaveRand = sawRandVars;
                    sawRandVars = oldSawRand;
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return fail();
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    if (context.getCompilation().languageVersion() < LanguageVersion::v1800_2023) {
                        context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    auto& binExpr = expr.template as<BinaryExpression>();
                    switch (binExpr.op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return fail();
                        case BinaryOperator::Equality:
                        case BinaryOperator::Inequality:
                        case BinaryOperator::GreaterThanEqual:
                        case BinaryOperator::GreaterThan:
                        case BinaryOperator::LessThanEqual:
                        case BinaryOperator::LessThan:
                        case BinaryOperator::LogicalAnd:
                        case BinaryOperator::LogicalOr:
                        case BinaryOperator::LogicalImplication:
                        case BinaryOperator::LogicalEquivalence:
                            // We previously ignored invalid types of NamedValues when
                            // we visited subexpressions. If there were any rand vars
                            // used in our subexpressions we should re-check named values
                            // for the stricter integral / numeric type requirements.
                            if (childrenHaveRand) {
                                if (ValueExpressionBase::isKind(binExpr.left().kind) &&
                                    !checkType(binExpr.left())) {
                                    return fail();
                                }

                                if (ValueExpressionBase::isKind(binExpr.right().kind) &&
                                    !checkType(binExpr.right())) {
                                    return fail();
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                    if (!isTop)
                        return true;
                    break;
                case ExpressionKind::ValueRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return fail();
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                arg->direction == ArgumentDirection::InOut ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return fail();
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!checkType(expr))
                return fail();
        }

        return true;
    }